

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O0

void google::protobuf::json_internal::anon_unknown_4::
     WriteEnum<google::protobuf::json_internal::UnparseProto2Descriptor>
               (JsonWriter *writer,
               Field<google::protobuf::json_internal::UnparseProto2Descriptor> field,int32_t value,
               IntegerEnumStyle int_style)

{
  bool bVar1;
  MessageType MVar2;
  WriterOptions *pWVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  IntegerEnumStyle number;
  string_view sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_68 [8];
  StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> name;
  json_internal *local_30;
  IntegerEnumStyle int_style_local;
  int32_t value_local;
  Field<google::protobuf::json_internal::UnparseProto2Descriptor> field_local;
  JsonWriter *writer_local;
  
  number = int_style;
  sVar5 = Proto2Descriptor::FieldTypeName(field);
  local_30 = (json_internal *)sVar5._M_len;
  sVar5._M_len = (size_t)sVar5._M_str;
  MVar2 = ClassifyMessage(local_30,sVar5);
  if (MVar2 == kNull) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               ((long)&name.
                       super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_1.data_.field_2 + 8),"null");
    JsonWriter::Write(writer,stack0xffffffffffffffc0);
  }
  else {
    pWVar3 = JsonWriter::options(writer);
    if ((pWVar3->always_print_enums_as_ints & 1U) == 0) {
      Proto2Descriptor::EnumNameByNumber_abi_cxx11_
                ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_68,(Proto2Descriptor *)field,(Field)(ulong)(uint)value,number);
      bVar1 = absl::lts_20240722::
              StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::ok((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_68);
      if (bVar1) {
        pbVar4 = absl::lts_20240722::
                 StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_68);
        std::__cxx11::string::string((string *)&local_98,(string *)pbVar4);
        JsonWriter::Write<char_const*,std::__cxx11::string,char_const*>(writer,"\"",&local_98,"\"");
        std::__cxx11::string::~string((string *)&local_98);
      }
      absl::lts_20240722::
      StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~StatusOr((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_68);
      if (bVar1) {
        return;
      }
    }
    if (int_style == kQuoted) {
      JsonWriter::Write<char_const*,int,char_const*>(writer,"\"",value,"\"");
    }
    else {
      JsonWriter::Write(writer,value);
    }
  }
  return;
}

Assistant:

void WriteEnum(JsonWriter& writer, Field<Traits> field, int32_t value,
               IntegerEnumStyle int_style = IntegerEnumStyle::kUnquoted) {
  if (ClassifyMessage(Traits::FieldTypeName(field)) == MessageType::kNull) {
    writer.Write("null");
    return;
  }

  if (!writer.options().always_print_enums_as_ints) {
    auto name = Traits::EnumNameByNumber(field, value);
    if (name.ok()) {
      writer.Write("\"", *name, "\"");
      return;
    }
  }

  if (int_style == IntegerEnumStyle::kQuoted) {
    writer.Write("\"", value, "\"");
  } else {
    writer.Write(value);
  }
}